

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

bool __thiscall QVariant::equals(QVariant *this,QVariant *v)

{
  PrivateShared *pPVar1;
  bool bVar2;
  QPartialOrdering QVar3;
  long in_FS_OFFSET;
  QMetaType metatype;
  QMetaType local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  local_30.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar2 = ::comparesEqual(&local_28,&local_30);
  if (bVar2) {
    if (local_28.d_ptr == (QMetaTypeInterface *)0x0) {
      bVar2 = true;
    }
    else {
      if (((this->d).field_0x18 & 1) != 0) {
        pPVar1 = (this->d).data.shared;
        this = (QVariant *)
               ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      if (((v->d).field_0x18 & 1) != 0) {
        pPVar1 = (v->d).data.shared;
        v = (QVariant *)
            ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int> + (long)pPVar1->offset);
      }
      bVar2 = QMetaType::equals(&local_28,this,v);
    }
  }
  else {
    bVar2 = canBeNumericallyCompared
                      (local_28.d_ptr,
                       (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc));
    if (bVar2) {
      QVar3 = numericCompare(&this->d,&v->d);
    }
    else {
      bVar2 = qvCanConvertMetaObject
                        (local_28,(QMetaTypeInterface *)
                                  (*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc));
      if (!bVar2) {
        bVar2 = false;
        goto LAB_002d5db1;
      }
      QVar3 = pointerCompare(&this->d,&v->d);
    }
    bVar2 = QVar3.m_order == '\0';
  }
LAB_002d5db1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::equals(const QVariant &v) const
{
    auto metatype = d.type();

    if (metatype != v.metaType()) {
        // try numeric comparisons, with C++ type promotion rules (no conversion)
        if (canBeNumericallyCompared(metatype.iface(), v.d.type().iface()))
            return numericCompare(&d, &v.d) == QPartialOrdering::Equivalent;
        // if both types are related pointers to QObjects, check if they point to the same object
        if (qvCanConvertMetaObject(metatype, v.metaType()))
            return pointerCompare(&d, &v.d) == QPartialOrdering::Equivalent;
        return false;
    }

    // For historical reasons: QVariant() == QVariant()
    if (!metatype.isValid())
        return true;

    return metatype.equals(d.storage(), v.d.storage());
}